

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_get_place_proc_ids(int place_num,int ids_size,int *ids)

{
  _func_int *p_Var1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  ulong uVar8;
  undefined8 uStack_60;
  undefined1 auStack_58 [4];
  uint local_54;
  undefined1 *local_50;
  long *local_48;
  kmp_affin_mask_t *mask;
  ulong local_38;
  unsigned_long __vla_expr0;
  int local_28;
  uint local_24;
  int count;
  int i;
  int *ids_local;
  int local_10;
  int ids_size_local;
  int place_num_local;
  
  __vla_expr0 = (unsigned_long)auStack_58;
  local_38 = (ulong)(uint)ids_size;
  lVar3 = -(local_38 * 4 + 0xf & 0xfffffffffffffff0);
  local_50 = auStack_58 + lVar3;
  if (__kmp_affin_mask_size == 0) {
    ids_size_local = 0;
  }
  else if ((place_num < 0) || ((int)__kmp_affinity_num_masks <= place_num)) {
    ids_size_local = 0;
  }
  else {
    p_Var1 = __kmp_affinity_dispatch->_vptr_KMPAffinity[8];
    _count = ids;
    ids_local._4_4_ = ids_size;
    local_10 = place_num;
    *(undefined8 *)((long)&uStack_60 + lVar3) = 0x1d25ed;
    iVar5 = (*p_Var1)(__kmp_affinity_dispatch,__kmp_affinity_masks,(ulong)(uint)place_num);
    local_48 = (long *)CONCAT44(extraout_var,iVar5);
    local_28 = 0;
    pcVar2 = *(code **)(*local_48 + 0x50);
    *(undefined8 *)((long)&uStack_60 + lVar3) = 0x1d2602;
    local_24 = (*pcVar2)();
    while( true ) {
      local_54 = local_24;
      pcVar2 = *(code **)(*local_48 + 0x58);
      *(undefined8 *)((long)&uStack_60 + lVar3) = 0x1d2615;
      uVar6 = (*pcVar2)();
      if (local_54 == uVar6) break;
      uVar8 = (ulong)local_24;
      p_Var1 = __kmp_affin_fullMask->_vptr_Mask[3];
      *(undefined8 *)((long)&uStack_60 + lVar3) = 0x1d2631;
      uVar7 = (*p_Var1)(__kmp_affin_fullMask,uVar8);
      uVar6 = local_24;
      plVar4 = local_48;
      if ((uVar7 & 1) != 0) {
        pcVar2 = *(code **)(*local_48 + 0x18);
        *(undefined8 *)((long)&uStack_60 + lVar3) = 0x1d2644;
        uVar8 = (*pcVar2)(plVar4,uVar6);
        if ((uVar8 & 1) != 0) {
          if (local_28 < ids_local._4_4_) {
            *(uint *)(local_50 + (long)local_28 * 4) = local_24;
          }
          local_28 = local_28 + 1;
        }
      }
      uVar6 = local_24;
      plVar4 = local_48;
      pcVar2 = *(code **)(*local_48 + 0x60);
      *(undefined8 *)((long)&uStack_60 + lVar3) = 0x1d2676;
      local_24 = (*pcVar2)(plVar4,uVar6);
    }
    if (local_28 <= ids_local._4_4_) {
      for (local_24 = 0; (int)local_24 < local_28; local_24 = local_24 + 1) {
        _count[(int)local_24] = *(int *)(local_50 + (long)(int)local_24 * 4);
      }
    }
    ids_size_local = local_28;
  }
  return ids_size_local;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_place_proc_ids(int place_num, int ids_size,
                                             int *ids) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  int i, count;
  int tmp_ids[ids_size];
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  if (place_num < 0 || place_num >= (int)__kmp_affinity_num_masks)
    return 0;
  /* TODO: Is this safe for asynchronous call from signal handler during runtime
   * shutdown? */
  kmp_affin_mask_t *mask = KMP_CPU_INDEX(__kmp_affinity_masks, place_num);
  count = 0;
  KMP_CPU_SET_ITERATE(i, mask) {
    if ((!KMP_CPU_ISSET(i, __kmp_affin_fullMask)) ||
        (!KMP_CPU_ISSET(i, mask))) {
      continue;
    }
    if (count < ids_size)
      tmp_ids[count] = i;
    count++;
  }
  if (ids_size >= count) {
    for (i = 0; i < count; i++) {
      ids[i] = tmp_ids[i];
    }
  }
  return count;
#endif
}